

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall
SymbolTable::findEquation(SymbolTable *this,Identifier *name,int file,int section,size_t *dest)

{
  char *pcVar1;
  int section_00;
  iterator iVar2;
  int file_00;
  bool bVar3;
  SymbolKey key;
  SymbolKey local_40;
  
  pcVar1 = (name->_name)._M_dataplus._M_p;
  section_00 = -1;
  file_00 = -1;
  if (*pcVar1 == '@') {
    if (pcVar1[1] == '@') {
      file_00 = -1;
      section_00 = section;
    }
    else {
      section_00 = -1;
      file_00 = file;
    }
  }
  SymbolKey::SymbolKey(&local_40,name,file_00,section_00);
  iVar2 = std::
          _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
          ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                  *)this,&local_40);
  if (((_Rb_tree_header *)iVar2._M_node == &(this->symbols)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar2._M_node[2]._M_parent != 1)) {
    bVar3 = false;
  }
  else {
    *dest = (size_t)iVar2._M_node[2]._M_left;
    bVar3 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != &local_40.name.field_2) {
    operator_delete(local_40.name._M_dataplus._M_p,local_40.name.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool SymbolTable::findEquation(const Identifier& name, int file, int section, size_t& dest)
{
	setFileSectionValues(name,file,section);
	
	SymbolKey key = { name, file, section };
	auto it = symbols.find(key);
	if (it == symbols.end() || it->second.type != EquationSymbol)
		return false;

	dest = it->second.index;
	return true;
}